

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

uint32 __thiscall Process::start(Process *this,String *commandLine,Map<String,_String> *environment)

{
  long lVar1;
  Process *this_00;
  ItemBlock *environment_00;
  int *piVar2;
  char **argv_00;
  String *pSVar3;
  char *pcStack_140;
  uint32 local_134;
  String *local_130;
  char *local_128;
  String *local_120;
  undefined1 local_111;
  Iterator *local_110;
  Iterator *local_108;
  usize local_100;
  undefined1 local_f1;
  List<String> *local_f0;
  Process *local_e8;
  Iterator local_e0;
  Iterator end;
  Iterator j;
  int i;
  char **argv;
  undefined1 local_88 [8];
  List<String> command;
  Map<String,_String> *environment_local;
  String *commandLine_local;
  Process *this_local;
  
  local_e8 = this;
  command.blocks = (ItemBlock *)environment;
  if (this->pid == 0) {
    local_f0 = (List<String> *)local_88;
    pcStack_140 = (char *)0x10d77f;
    List<String>::List(local_f0);
    pcStack_140 = (char *)0x10d78f;
    Private::splitCommandLine(commandLine,local_f0);
    pcStack_140 = (char *)0x10d79a;
    local_f1 = List<String>::isEmpty((List<String> *)local_88);
    if ((bool)local_f1) {
      pcStack_140 = (char *)0x10d7ba;
      String::String((String *)&argv);
      pcStack_140 = (char *)0x10d7cc;
      List<String>::append((List<String> *)local_88,(String *)&argv);
      pcStack_140 = (char *)0x10d7da;
      String::~String((String *)&argv);
    }
    pcStack_140 = (char *)0x10d81f;
    local_100 = List<String>::size((List<String> *)local_88);
    lVar1 = -(local_100 * 8 + 0x17 & 0xfffffffffffffff0);
    argv_00 = (char **)(&stack0xfffffffffffffec8 + lVar1);
    j.item._4_4_ = 0;
    *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d85e;
    local_108 = List<String>::begin((List<String> *)local_88);
    end.item = local_108->item;
    *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d881;
    local_110 = List<String>::end((List<String> *)local_88);
    local_e0.item = local_110->item;
    while( true ) {
      *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d8ae;
      local_111 = List<String>::Iterator::operator!=(&end,&local_e0);
      if (!(bool)local_111) break;
      *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d8ce;
      pSVar3 = List<String>::Iterator::operator*(&end);
      local_120 = pSVar3;
      *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d8e3;
      local_128 = String::operator_cast_to_char_(pSVar3);
      argv_00[j.item._4_4_] = local_128;
      *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d91e;
      List<String>::Iterator::operator++(&end);
      j.item._4_4_ = j.item._4_4_ + 1;
    }
    argv_00[j.item._4_4_] = (char *)0x0;
    *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d944;
    pSVar3 = List<String>::front((List<String> *)local_88);
    environment_00 = command.blocks;
    this_00 = local_e8;
    local_130 = pSVar3;
    *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d973;
    this_local._4_4_ =
         start(this_00,pSVar3,j.item._4_4_ + 1,argv_00,(Map<String,_String> *)environment_00);
    local_134 = this_local._4_4_;
    *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x10d98d;
    List<String>::~List((List<String> *)local_88);
  }
  else {
    pcStack_140 = (char *)0x10d75d;
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

uint32 Process::start(const String& commandLine, const Map<String, String>& environment)
{
#ifdef _WIN32
  if(hProcess != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return 0;
  }

  STARTUPINFO si;
  PROCESS_INFORMATION pi;

  ZeroMemory(&si, sizeof(si));
  si.cb = sizeof(si);
  ZeroMemory(&pi, sizeof(pi));

  LPTSTR env = NULL;
  Buffer envBuffer;
  if (!environment.isEmpty())
  {
    usize bufferSize = 1;
    for (Map<String, String>::Iterator i = environment.begin(); i != environment.end(); ++i)
    {
      const String& key = i.key();
      const String& val = *i;
      if (key.isEmpty() || val.isEmpty())
          continue;
      bufferSize += key.length() + val.length() + 2;
    }
    envBuffer.reserve(bufferSize * sizeof(char));
    LPTSTR lptEnv = (LPTSTR)(byte*)envBuffer;
    env = lptEnv;
    for (Map<String, String>::Iterator i = environment.begin(); i != environment.end(); ++i)
    {
      const String& key = i.key();
      const String& val = *i;
      if (key.isEmpty() || val.isEmpty())
        continue;
      memcpy(lptEnv, (const char*)key, key.length() * sizeof(char));
      lptEnv += key.length();
      *(lptEnv++) = '=';
      memcpy(lptEnv, (const char*)val, val.length() * sizeof(char));
      lptEnv += val.length();
      *(lptEnv++) = '\0';
    }
    *lptEnv = '\0';
  }

  String args(commandLine);
  if(!CreateProcess(NULL, (char*)args, NULL, NULL, FALSE, 
#ifdef UNICODE
      CREATE_UNICODE_ENVIRONMENT
#else
      0
#endif
      , env, NULL, &si, &pi))
    return 0;

  CloseHandle(pi.hThread);

  ASSERT(pi.hProcess);
  hProcess = pi.hProcess;
  pid = pi.dwProcessId;

  return pi.dwProcessId;

#else
  if(pid)
  {
    errno = EINVAL;
    return false;
  }

  List<String> command;
  Private::splitCommandLine(commandLine, command);
  if(command.isEmpty())
    command.append(String());

  char** argv = (char**)alloca(sizeof(char*) * (command.size() + 1));
  int i = 0;
  for (List<String>::Iterator j = command.begin(), end = command.end(); j != end; ++j)
    argv[i++] = (char*)(const char*)*j;
  argv[i] = 0;
  return start(command.front(), i + 1, argv, environment);
#endif
}